

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_CalculateIssuanceValueTest_Test::TestBody
          (ConfidentialTransaction_CalculateIssuanceValueTest_Test *this)

{
  ConfidentialAssetId *this_00;
  ConfidentialAssetId *this_01;
  bool bVar1;
  char *pcVar2;
  AssertHelper AStack_168;
  AssertionResult gtest_ar_3;
  ByteData256 contract_hash;
  IssuanceParameter local_130;
  ByteData256 contract_hash_empty;
  Txid txid;
  IssuanceParameter param;
  
  std::__cxx11::string::string
            ((string *)&param,"d1efb621591f94f66a9c3161addd6d7db0ae82cc1674e3b098051793fb70028a",
             (allocator *)&local_130);
  cfd::core::Txid::Txid(&txid,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  cfd::core::ByteData256::ByteData256(&contract_hash_empty);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::ByteData256(&contract_hash);
      cfd::core::ConfidentialTransaction::CalculateIssuanceValue
                (&local_130,&txid,1,false,&contract_hash_empty,&contract_hash);
      cfd::core::IssuanceParameter::operator=(&param,&local_130);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_130);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
    }
  }
  else {
    testing::Message::Message((Message *)&local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&contract_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5c5,
               "Expected: (param = ConfidentialTransaction::CalculateIssuanceValue( txid, vout, false, contract_hash_empty, ByteData256())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&contract_hash,(Message *)&local_130)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&contract_hash);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_130,&param.entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&contract_hash,"param.entropy.GetHex().c_str()",
             "\"18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  std::__cxx11::string::~string((string *)&local_130);
  if ((char)contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_130);
    if (contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)contract_hash.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5c8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&contract_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  this_00 = &param.asset;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_130,this_00);
  testing::internal::CmpHelperSTREQ
            ((internal *)&contract_hash,"param.asset.GetHex().c_str()",
             "\"598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  std::__cxx11::string::~string((string *)&local_130);
  if ((char)contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_130);
    if (contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)contract_hash.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5cb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&contract_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  this_01 = &param.token;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_130,this_01);
  testing::internal::CmpHelperSTREQ
            ((internal *)&contract_hash,"param.token.GetHex().c_str()",
             "\"4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993");
  std::__cxx11::string::~string((string *)&local_130);
  if ((char)contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_130);
    if (contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)contract_hash.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&contract_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&local_130,"fdf4d615b2b78b61c85ccd5129584dc1b7cbd6c75a1c799cc0738bc783dafd68"
             ,(allocator *)&gtest_ar_3);
  cfd::core::ByteData256::ByteData256(&contract_hash,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::ByteData256((ByteData256 *)&gtest_ar_3);
      cfd::core::ConfidentialTransaction::CalculateIssuanceValue
                (&local_130,&txid,1,false,&contract_hash,(ByteData256 *)&gtest_ar_3);
      cfd::core::IssuanceParameter::operator=(&param,&local_130);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_130);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
    }
  }
  else {
    testing::Message::Message((Message *)&local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5d7,
               "Expected: (param = ConfidentialTransaction::CalculateIssuanceValue(txid, vout, false, contract_hash, ByteData256())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_130,&param.entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"param.entropy.GetHex().c_str()",
             "\"9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c");
  std::__cxx11::string::~string((string *)&local_130);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5da,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_130,this_00);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"param.asset.GetHex().c_str()",
             "\"76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303");
  std::__cxx11::string::~string((string *)&local_130);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5dd,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_130,this_01);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"param.token.GetHex().c_str()",
             "\"e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879");
  std::__cxx11::string::~string((string *)&local_130);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5e0,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::ByteData256((ByteData256 *)&gtest_ar_3);
      cfd::core::ConfidentialTransaction::CalculateIssuanceValue
                (&local_130,&txid,1,true,&contract_hash_empty,(ByteData256 *)&gtest_ar_3);
      cfd::core::IssuanceParameter::operator=(&param,&local_130);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_130);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
    }
  }
  else {
    testing::Message::Message((Message *)&local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5e5,
               "Expected: (param = ConfidentialTransaction::CalculateIssuanceValue( txid, vout, true, contract_hash_empty, ByteData256())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_130,&param.entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"param.entropy.GetHex().c_str()",
             "\"18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  std::__cxx11::string::~string((string *)&local_130);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5e8,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_130,this_00);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"param.asset.GetHex().c_str()",
             "\"598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  std::__cxx11::string::~string((string *)&local_130);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5eb,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_130,this_01);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"param.token.GetHex().c_str()",
             "\"3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610\"",
             (char *)local_130.entropy._vptr_BlindFactor,
             "3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610");
  std::__cxx11::string::~string((string *)&local_130);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5ee,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash_empty);
  cfd::core::Txid::~Txid(&txid);
  return;
}

Assistant:

TEST(ConfidentialTransaction, CalculateIssuanceValueTest) {
  Txid txid("d1efb621591f94f66a9c3161addd6d7db0ae82cc1674e3b098051793fb70028a");
  uint32_t vout = 1;
  ByteData256 contract_hash_empty;
  IssuanceParameter param;

  // not blind
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(
          txid, vout, false, contract_hash_empty, ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993");

  // contract hash
  ByteData256 contract_hash(
      "fdf4d615b2b78b61c85ccd5129584dc1b7cbd6c75a1c799cc0738bc783dafd68");
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(txid, vout,
                                                               false,
                                                               contract_hash,
                                                               ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879");

  // blind
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(
          txid, vout, true, contract_hash_empty, ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610");
}